

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

int Acb_ObjRemoveDupFanins_int(Acb_Ntk_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint j;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  
  puVar3 = (uint *)Acb_ObjFanins(p,iObj);
  uVar2 = *puVar3;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  puVar7 = puVar3 + 2;
  uVar5 = 0;
  do {
    if (uVar5 == uVar6) {
      return 0;
    }
    uVar4 = uVar5 & 0xffffffff;
    puVar8 = puVar7;
    while( true ) {
      j = (int)uVar4 + 1;
      uVar4 = (ulong)j;
      if ((int)uVar2 <= (int)j) break;
      uVar1 = *puVar8;
      puVar8 = puVar8 + 1;
      if (puVar3[uVar5 + 1] == uVar1) {
        Acb_ObjRemoveDup(p,iObj,(int)uVar5,j);
        return 1;
      }
    }
    puVar7 = puVar7 + 1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Acb_ObjRemoveDupFanins_int( Acb_Ntk_t * p, int iObj )
{
    int i, k, * pFanins = Acb_ObjFanins( p, iObj );
    for ( i = 0; i < pFanins[0]; i++ )
    for ( k = i+1; k < pFanins[0]; k++ )
    {
        if ( pFanins[1+i] != pFanins[1+k] )
            continue;
        Acb_ObjRemoveDup( p, iObj, i, k );
        return 1;
    }
    return 0;
}